

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

void __thiscall
pbrt::PixelSensor::PixelSensor
          (PixelSensor *this,RGBColorSpace *outputColorSpace,Float wbTemp,Float imagingRatio,
          Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  SquareMatrix<3> *in_RDI;
  float in_XMM0_Da;
  Point2f PVar3;
  undefined8 uVar4;
  undefined8 extraout_XMM0_Qb;
  Float in_XMM1_Da;
  XYZ XVar5;
  Point2f targetWhite;
  Point2f sourceWhite;
  DenselySampledSpectrum whiteIlluminant;
  DenselySampledSpectrum *in_stack_fffffffffffffea8;
  SpectrumHandle *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  DenselySampledSpectrum *in_stack_fffffffffffffec8;
  Allocator in_stack_fffffffffffffed0;
  undefined1 local_ec [12];
  SpectrumHandle *in_stack_ffffffffffffff20;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  Allocator in_stack_ffffffffffffffc8;
  
  SquareMatrix<3>::SquareMatrix(in_RDI);
  Spectra::X();
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_stack_fffffffffffffec8,
             (SpectrumHandle *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffed0);
  Spectra::Y();
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_stack_fffffffffffffec8,
             (SpectrumHandle *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffed0);
  Spectra::Z();
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_stack_fffffffffffffec8,
             (SpectrumHandle *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffed0);
  in_RDI[4].m[1][1] = in_XMM1_Da;
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    uVar4 = 0;
    Spectra::D(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc8);
    SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    XVar5 = SpectrumToXYZ(in_stack_ffffffffffffff20);
    auVar2._8_8_ = uVar4;
    auVar2._0_8_ = XVar5._0_8_;
    vmovlpd_avx(auVar2);
    PVar3 = XYZ::xy((XYZ *)in_stack_fffffffffffffea8);
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_4_ = PVar3.super_Tuple2<pbrt::Point2,_float>.x;
    auVar1._4_4_ = PVar3.super_Tuple2<pbrt::Point2,_float>.y;
    vmovlpd_avx(auVar1);
    PVar3.super_Tuple2<pbrt::Point2,_float>.y = in_stack_ffffffffffffffc4;
    PVar3.super_Tuple2<pbrt::Point2,_float>.x = in_stack_ffffffffffffffc0;
    WhiteBalance(PVar3,(Point2f)in_stack_ffffffffffffffb8);
    memcpy(in_RDI,local_ec,0x24);
    DenselySampledSpectrum::~DenselySampledSpectrum((DenselySampledSpectrum *)0x768ebb);
  }
  return;
}

Assistant:

PixelSensor(const RGBColorSpace *outputColorSpace, Float wbTemp, Float imagingRatio,
                Allocator alloc)
        : r_bar(&Spectra::X(), alloc),
          g_bar(&Spectra::Y(), alloc),
          b_bar(&Spectra::Z(), alloc),
          imagingRatio(imagingRatio) {
        // Compute white balancing matrix for XYZ _PixelSensor_
        if (wbTemp != 0) {
            auto whiteIlluminant = Spectra::D(wbTemp, alloc);
            Point2f sourceWhite = SpectrumToXYZ(&whiteIlluminant).xy();
            Point2f targetWhite = outputColorSpace->w;
            XYZFromSensorRGB = WhiteBalance(sourceWhite, targetWhite);
        }
    }